

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O2

void __thiscall imrt::ACO::evaporation(ACO *this)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  int local_44;
  Matrix local_40;
  
  lVar3 = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles(this->collimator);
    if (iVar1 <= lVar3) break;
    for (local_44 = 0; local_44 < this->max_apertures; local_44 = local_44 + 1) {
      pmVar2 = std::
               map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
               ::operator[]((this->pheromone).
                            super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3,&local_44);
      maths::operator*((maths *)&local_40,pmVar2,1.0 - this->rho);
      pmVar2 = std::
               map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
               ::operator[]((this->pheromone).
                            super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3,&local_44);
      maths::Matrix::operator=(pmVar2,&local_40);
      maths::Matrix::~Matrix(&local_40);
      maths::operator*((maths *)&local_40,
                       (this->ipheromone).
                       super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3,1.0 - this->rho);
      maths::Matrix::operator=
                ((this->ipheromone).
                 super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar3,&local_40);
      maths::Matrix::~Matrix(&local_40);
    }
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void evaporation () {
    for (int s =0 ; s< collimator.getNbAngles();s++) 
      for (int a=0; a<max_apertures;a++) {
        pheromone[s][a] =  pheromone[s][a] *(1.0-rho);
        ipheromone[s] = ipheromone[s] *(1.0-rho);
      }
  }